

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O1

shared_ptr<helics::helicsCLI11App> __thiscall helics::apps::Clone::buildArgParserApp(Clone *this)

{
  App *pAVar1;
  Option *this_00;
  HelicsException *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  shared_ptr<helics::helicsCLI11App> sVar3;
  string_view message;
  undefined1 local_b1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (this->super_App)._vptr_App = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<helics::helicsCLI11App,std::allocator<helics::helicsCLI11App>,char_const(&)[39]>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_App).fed,
             (helicsCLI11App **)this,(allocator<helics::helicsCLI11App> *)&local_b1,
             (char (*) [39])"Command line options for the Clone App");
  pAVar1 = (App *)(this->super_App)._vptr_App;
  if (pAVar1 != (App *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"--allow_iteration","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"allow iteration on values","");
    this_00 = CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
                        (pAVar1,&local_50,(bool *)(in_RSI + 0xa0),&local_70);
    CLI::Option::ignore_underscore<CLI::App>(this_00,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pAVar1 = (App *)(this->super_App)._vptr_App;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"--capture,capture","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "clone all the interfaces of a particular federate federate capture=\"fed1;fed2\"  supports multiple arguments or a semicolon/comma separated list"
               ,"");
    CLI::App::
    add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
              (pAVar1,&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x218)
               ,&local_b0);
    _Var2._M_pi = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      _Var2._M_pi = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      _Var2._M_pi = extraout_RDX_01;
    }
    sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<helics::helicsCLI11App>)
           sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_01 = (HelicsException *)__cxa_allocate_exception(0x28);
  message._M_str = "unable to allocate application CLI";
  message._M_len = 0x22;
  HelicsException::HelicsException(this_01,message);
  *(undefined ***)this_01 = &PTR__HelicsException_005598a0;
  __cxa_throw(this_01,&FunctionExecutionFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

std::shared_ptr<helicsCLI11App> Clone::buildArgParserApp()
{
    auto app = std::make_shared<helicsCLI11App>("Command line options for the Clone App");
    if (!app) {
        throw(FunctionExecutionFailure("unable to allocate application CLI"));
    }
    app->add_flag("--allow_iteration", allow_iteration, "allow iteration on values")
        ->ignore_underscore();

    app->add_option(
        "--capture,capture",
        captureFederate,
        "clone all the interfaces of a particular federate federate capture=\"fed1;fed2\"  "
        "supports multiple arguments or a semicolon/comma separated list");

    return app;
}